

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::iterate
          (SamplePosRasterizationTest *this)

{
  bool bVar1;
  SamplePosRasterizationTest *this_local;
  
  bVar1 = testMultisampleTexture(this,this->m_iteration);
  this->m_allIterationsOk = (this->m_allIterationsOk & 1U & bVar1) != 0;
  this->m_iteration = this->m_iteration + 1;
  if (this->m_iteration < this->m_samples) {
    this_local._4_4_ = CONTINUE;
  }
  else {
    if ((this->m_allIterationsOk & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Pixel comparison failed");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

SamplePosRasterizationTest::IterateResult SamplePosRasterizationTest::iterate (void)
{
	m_allIterationsOk &= testMultisampleTexture(m_iteration);
	m_iteration++;

	if (m_iteration < m_samples)
		return CONTINUE;

	// End result
	if (m_allIterationsOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Pixel comparison failed");

	return STOP;
}